

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int duckdb_je_ctl_nametomib(tsd_t *tsd,char *name,size_t *mibp,size_t *miblenp)

{
  _Bool _Var1;
  int ret;
  size_t *in_stack_00000038;
  size_t *in_stack_00000040;
  ctl_named_node_t **in_stack_00000048;
  char *in_stack_00000050;
  ctl_named_node_t *in_stack_00000058;
  tsdn_t *in_stack_00000060;
  int local_2c;
  tsd_t *in_stack_fffffffffffffff8;
  
  if ((ctl_initialized) || (_Var1 = ctl_init(in_stack_fffffffffffffff8), !_Var1)) {
    local_2c = ctl_lookup(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                          in_stack_00000040,in_stack_00000038);
  }
  else {
    local_2c = 0xb;
  }
  return local_2c;
}

Assistant:

int
ctl_nametomib(tsd_t *tsd, const char *name, size_t *mibp, size_t *miblenp) {
	int ret;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookup(tsd_tsdn(tsd), super_root_node, name, NULL, mibp,
	    miblenp);
label_return:
	return(ret);
}